

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O1

bool __thiscall
cmdline::parser::option_with_value<double>::set(option_with_value<double> *this,string *value)

{
  double extraout_XMM0_Qa;
  
  (*(this->super_option_base)._vptr_option_base[0xc])();
  this->actual = extraout_XMM0_Qa;
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value) {
      try {
        actual = read(value);
        has = true;
      } catch (const std::exception &e) {
        return false;
      }
      return true;
    }